

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Generators<arg_res_tuple<double,_1UL>_> *
Catch::Generators::
makeGenerators<arg_res_tuple<double,1ul>,arg_res_tuple<double,1ul>,arg_res_tuple<double,1ul>,arg_res_tuple<double,1ul>,arg_res_tuple<double,1ul>,arg_res_tuple<double,1ul>,arg_res_tuple<double,1ul>,arg_res_tuple<double,1ul>,arg_res_tuple<double,1ul>,arg_res_tuple<double,1ul>,arg_res_tuple<double,1ul>,arg_res_tuple<double,1ul>,arg_res_tuple<double,1ul>,arg_res_tuple<double,1ul>,arg_res_tuple<double,1ul>,arg_res_tuple<double,1ul>,arg_res_tuple<double,1ul>,arg_res_tuple<double,1ul>,arg_res_tuple<double,1ul>,arg_res_tuple<double,1ul>,arg_res_tuple<double,1ul>,arg_res_tuple<double,1ul>>
          (arg_res_tuple<double,_1UL> *val,arg_res_tuple<double,_1UL> *moreGenerators,
          arg_res_tuple<double,_1UL> *moreGenerators_1,arg_res_tuple<double,_1UL> *moreGenerators_2,
          arg_res_tuple<double,_1UL> *moreGenerators_3,arg_res_tuple<double,_1UL> *moreGenerators_4,
          arg_res_tuple<double,_1UL> *moreGenerators_5,arg_res_tuple<double,_1UL> *moreGenerators_6,
          arg_res_tuple<double,_1UL> *moreGenerators_7,arg_res_tuple<double,_1UL> *moreGenerators_8,
          arg_res_tuple<double,_1UL> *moreGenerators_9,arg_res_tuple<double,_1UL> *moreGenerators_10
          ,arg_res_tuple<double,_1UL> *moreGenerators_11,
          arg_res_tuple<double,_1UL> *moreGenerators_12,
          arg_res_tuple<double,_1UL> *moreGenerators_13,
          arg_res_tuple<double,_1UL> *moreGenerators_14,
          arg_res_tuple<double,_1UL> *moreGenerators_15,
          arg_res_tuple<double,_1UL> *moreGenerators_16,
          arg_res_tuple<double,_1UL> *moreGenerators_17,
          arg_res_tuple<double,_1UL> *moreGenerators_18,
          arg_res_tuple<double,_1UL> *moreGenerators_19,
          arg_res_tuple<double,_1UL> *moreGenerators_20)

{
  arg_res_tuple<double,_1UL> *in_RCX;
  arg_res_tuple<double,_1UL> *unaff_RBX;
  arg_res_tuple<double,_1UL> *unaff_RBP;
  Generators<arg_res_tuple<double,_1UL>_> *in_RDI;
  arg_res_tuple<double,_1UL> *unaff_R12;
  arg_res_tuple<double,_1UL> *unaff_R13;
  arg_res_tuple<double,_1UL> *unaff_R14;
  arg_res_tuple<double,_1UL> *unaff_R15;
  arg_res_tuple<double,_1UL> *unaff_retaddr;
  arg_res_tuple<double,_1UL> *in_stack_00000008;
  arg_res_tuple<double,_1UL> *in_stack_00000010;
  arg_res_tuple<double,_1UL> *in_stack_00000018;
  arg_res_tuple<double,_1UL> *in_stack_00000020;
  arg_res_tuple<double,_1UL> *in_stack_00000028;
  arg_res_tuple<double,_1UL> *in_stack_00000030;
  arg_res_tuple<double,_1UL> *in_stack_00000038;
  arg_res_tuple<double,_1UL> *in_stack_00000040;
  arg_res_tuple<double,_1UL> *in_stack_00000048;
  arg_res_tuple<double,_1UL> *in_stack_00000050;
  arg_res_tuple<double,_1UL> *in_stack_00000058;
  arg_res_tuple<double,_1UL> *in_stack_fffffffffffffed8;
  GeneratorWrapper<arg_res_tuple<double,_1UL>_> *in_stack_ffffffffffffff88;
  
  value<arg_res_tuple<double,1ul>>(in_stack_fffffffffffffed8);
  makeGenerators<arg_res_tuple<double,1ul>,arg_res_tuple<double,1ul>,arg_res_tuple<double,1ul>,arg_res_tuple<double,1ul>,arg_res_tuple<double,1ul>,arg_res_tuple<double,1ul>,arg_res_tuple<double,1ul>,arg_res_tuple<double,1ul>,arg_res_tuple<double,1ul>,arg_res_tuple<double,1ul>,arg_res_tuple<double,1ul>,arg_res_tuple<double,1ul>,arg_res_tuple<double,1ul>,arg_res_tuple<double,1ul>,arg_res_tuple<double,1ul>,arg_res_tuple<double,1ul>,arg_res_tuple<double,1ul>,arg_res_tuple<double,1ul>,arg_res_tuple<double,1ul>,arg_res_tuple<double,1ul>,arg_res_tuple<double,1ul>,arg_res_tuple<double,1ul>>
            (in_stack_ffffffffffffff88,in_RCX,in_stack_00000048,in_stack_00000050,in_stack_00000058,
             unaff_RBX,unaff_R12,unaff_R13,unaff_R14,unaff_R15,unaff_RBP,unaff_retaddr,
             in_stack_00000008,in_stack_00000010,in_stack_00000018,in_stack_00000020,
             in_stack_00000028,in_stack_00000030,in_stack_00000038,in_stack_00000040,
             in_stack_00000048,in_stack_00000050);
  GeneratorWrapper<arg_res_tuple<double,_1UL>_>::~GeneratorWrapper
            ((GeneratorWrapper<arg_res_tuple<double,_1UL>_> *)0x3c90c6);
  return in_RDI;
}

Assistant:

auto makeGenerators( T&& val, Gs &&... moreGenerators ) -> Generators<T> {
        return makeGenerators( value( std::forward<T>( val ) ), std::forward<Gs>( moreGenerators )... );
    }